

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  Scene *pSVar7;
  float **ppfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 (*pauVar72) [16];
  uint uVar73;
  undefined1 (*pauVar74) [16];
  long lVar75;
  long lVar76;
  ulong uVar77;
  uint uVar78;
  ulong uVar79;
  uint uVar80;
  ulong uVar81;
  ulong uVar82;
  Geometry *pGVar83;
  ulong uVar84;
  ulong uVar85;
  float fVar92;
  undefined1 auVar86 [16];
  float fVar94;
  undefined1 auVar87 [32];
  float fVar93;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  float fVar95;
  float fVar96;
  float fVar102;
  float fVar103;
  undefined1 auVar97 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar98 [32];
  float fVar104;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar118;
  float fVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar112 [32];
  undefined1 auVar111 [16];
  undefined1 auVar113 [32];
  float fVar120;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar129;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar127 [32];
  float fVar130;
  float fVar134;
  float fVar135;
  undefined1 auVar128 [32];
  float fVar138;
  float fVar139;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar143;
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar144;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar148 [64];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  float fVar157;
  float fVar158;
  undefined1 auVar159 [32];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar160 [64];
  float fVar173;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar177 [64];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  float fVar187;
  undefined1 auVar188 [32];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar189 [64];
  float fVar196;
  float fVar197;
  undefined1 auVar198 [32];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar199 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  float fVar216;
  undefined1 auVar217 [32];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar218 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_15e0 [32];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  RTCFilterFunctionNArguments local_1550;
  undefined1 local_1520 [32];
  undefined1 local_14f0 [16];
  undefined8 local_14e0;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [16];
  undefined1 local_1490 [16];
  undefined1 local_1480 [16];
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined1 local_1440 [16];
  undefined1 local_1430 [16];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar74 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1430._4_4_ = uVar2;
  local_1430._0_4_ = uVar2;
  local_1430._8_4_ = uVar2;
  local_1430._12_4_ = uVar2;
  auVar156 = ZEXT1664(local_1430);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1440._4_4_ = uVar2;
  local_1440._0_4_ = uVar2;
  local_1440._8_4_ = uVar2;
  local_1440._12_4_ = uVar2;
  auVar160 = ZEXT1664(local_1440);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1450._4_4_ = uVar2;
  local_1450._0_4_ = uVar2;
  local_1450._8_4_ = uVar2;
  local_1450._12_4_ = uVar2;
  auVar177 = ZEXT1664(local_1450);
  fVar95 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar102 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar86 = ZEXT416((uint)(fVar95 * 0.99999964));
  local_1460 = vshufps_avx(auVar86,auVar86,0);
  auVar186 = ZEXT1664(local_1460);
  auVar86 = ZEXT416((uint)(fVar102 * 0.99999964));
  local_1470 = vshufps_avx(auVar86,auVar86,0);
  auVar189 = ZEXT1664(local_1470);
  auVar86 = ZEXT416((uint)(fVar3 * 0.99999964));
  local_1480 = vshufps_avx(auVar86,auVar86,0);
  auVar199 = ZEXT1664(local_1480);
  auVar86 = ZEXT416((uint)(fVar95 * 1.0000004));
  local_1490 = vshufps_avx(auVar86,auVar86,0);
  auVar213 = ZEXT1664(local_1490);
  auVar86 = ZEXT416((uint)(fVar102 * 1.0000004));
  local_14a0 = vshufps_avx(auVar86,auVar86,0);
  auVar215 = ZEXT1664(local_14a0);
  auVar86 = ZEXT416((uint)(fVar3 * 1.0000004));
  local_14b0 = vshufps_avx(auVar86,auVar86,0);
  auVar218 = ZEXT1664(local_14b0);
  uVar82 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar85 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar84 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1220._16_16_ = mm_lookupmask_ps._240_16_;
  local_1220._0_16_ = mm_lookupmask_ps._0_16_;
  uVar80 = 1 << ((byte)k & 0x1f);
  auVar112._8_4_ = 0x3f800000;
  auVar112._0_8_ = 0x3f8000003f800000;
  auVar112._12_4_ = 0x3f800000;
  auVar112._16_4_ = 0x3f800000;
  auVar112._20_4_ = 0x3f800000;
  auVar112._24_4_ = 0x3f800000;
  auVar112._28_4_ = 0x3f800000;
  auVar87._8_4_ = 0xbf800000;
  auVar87._0_8_ = 0xbf800000bf800000;
  auVar87._12_4_ = 0xbf800000;
  auVar87._16_4_ = 0xbf800000;
  auVar87._20_4_ = 0xbf800000;
  auVar87._24_4_ = 0xbf800000;
  auVar87._28_4_ = 0xbf800000;
  iVar4 = (tray->tnear).field_0.i[k];
  local_14f0._4_4_ = iVar4;
  local_14f0._0_4_ = iVar4;
  local_14f0._8_4_ = iVar4;
  local_14f0._12_4_ = iVar4;
  auVar148 = ZEXT1664(local_14f0);
  local_1240 = vblendvps_avx(auVar112,auVar87,local_1220);
  iVar4 = (tray->tfar).field_0.i[k];
  auVar91 = ZEXT1664(CONCAT412(iVar4,CONCAT48(iVar4,CONCAT44(iVar4,iVar4))));
LAB_003a5cc9:
  do {
    pauVar72 = pauVar74 + -1;
    pauVar74 = pauVar74 + -1;
    if (*(float *)(*pauVar72 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar79 = *(ulong *)*pauVar74;
      while ((uVar79 & 8) == 0) {
        auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar79 + 0x20 + uVar82),auVar156._0_16_);
        auVar97._0_4_ = auVar186._0_4_ * auVar86._0_4_;
        auVar97._4_4_ = auVar186._4_4_ * auVar86._4_4_;
        auVar97._8_4_ = auVar186._8_4_ * auVar86._8_4_;
        auVar97._12_4_ = auVar186._12_4_ * auVar86._12_4_;
        auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar79 + 0x20 + uVar85),auVar160._0_16_);
        auVar108._0_4_ = auVar189._0_4_ * auVar86._0_4_;
        auVar108._4_4_ = auVar189._4_4_ * auVar86._4_4_;
        auVar108._8_4_ = auVar189._8_4_ * auVar86._8_4_;
        auVar108._12_4_ = auVar189._12_4_ * auVar86._12_4_;
        auVar86 = vmaxps_avx(auVar97,auVar108);
        auVar97 = vsubps_avx(*(undefined1 (*) [16])(uVar79 + 0x20 + uVar84),auVar177._0_16_);
        auVar109._0_4_ = auVar199._0_4_ * auVar97._0_4_;
        auVar109._4_4_ = auVar199._4_4_ * auVar97._4_4_;
        auVar109._8_4_ = auVar199._8_4_ * auVar97._8_4_;
        auVar109._12_4_ = auVar199._12_4_ * auVar97._12_4_;
        auVar97 = vmaxps_avx(auVar109,auVar148._0_16_);
        auVar97 = vmaxps_avx(auVar86,auVar97);
        auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar79 + 0x20 + (uVar82 ^ 0x10)),auVar156._0_16_
                            );
        auVar110._0_4_ = auVar213._0_4_ * auVar86._0_4_;
        auVar110._4_4_ = auVar213._4_4_ * auVar86._4_4_;
        auVar110._8_4_ = auVar213._8_4_ * auVar86._8_4_;
        auVar110._12_4_ = auVar213._12_4_ * auVar86._12_4_;
        auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar79 + 0x20 + (uVar85 ^ 0x10)),auVar160._0_16_
                            );
        auVar124._0_4_ = auVar215._0_4_ * auVar86._0_4_;
        auVar124._4_4_ = auVar215._4_4_ * auVar86._4_4_;
        auVar124._8_4_ = auVar215._8_4_ * auVar86._8_4_;
        auVar124._12_4_ = auVar215._12_4_ * auVar86._12_4_;
        auVar86 = vminps_avx(auVar110,auVar124);
        auVar108 = vsubps_avx(*(undefined1 (*) [16])(uVar79 + 0x20 + (uVar84 ^ 0x10)),
                              auVar177._0_16_);
        auVar125._0_4_ = auVar218._0_4_ * auVar108._0_4_;
        auVar125._4_4_ = auVar218._4_4_ * auVar108._4_4_;
        auVar125._8_4_ = auVar218._8_4_ * auVar108._8_4_;
        auVar125._12_4_ = auVar218._12_4_ * auVar108._12_4_;
        auVar108 = vminps_avx(auVar125,auVar91._0_16_);
        auVar86 = vminps_avx(auVar86,auVar108);
        auVar86 = vcmpps_avx(auVar97,auVar86,2);
        uVar78 = vmovmskps_avx(auVar86);
        local_1400._0_16_ = auVar97;
        if (uVar78 == 0) {
          if (pauVar74 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_003a5cc9;
        }
        uVar78 = uVar78 & 0xff;
        uVar77 = uVar79 & 0xfffffffffffffff0;
        lVar76 = 0;
        if (uVar78 != 0) {
          for (; (uVar78 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
          }
        }
        uVar79 = *(ulong *)(uVar77 + lVar76 * 8);
        uVar78 = uVar78 - 1 & uVar78;
        if (uVar78 != 0) {
          uVar73 = *(uint *)(local_1400 + lVar76 * 4);
          lVar76 = 0;
          if (uVar78 != 0) {
            for (; (uVar78 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
            }
          }
          uVar81 = *(ulong *)(uVar77 + lVar76 * 8);
          uVar6 = *(uint *)(local_1400 + lVar76 * 4);
          uVar78 = uVar78 - 1 & uVar78;
          if (uVar78 == 0) {
            if (uVar73 < uVar6) {
              *(ulong *)*pauVar74 = uVar81;
              *(uint *)(*pauVar74 + 8) = uVar6;
              pauVar74 = pauVar74 + 1;
            }
            else {
              *(ulong *)*pauVar74 = uVar79;
              *(uint *)(*pauVar74 + 8) = uVar73;
              pauVar74 = pauVar74 + 1;
              uVar79 = uVar81;
            }
          }
          else {
            auVar86._8_8_ = 0;
            auVar86._0_8_ = uVar79;
            auVar86 = vpunpcklqdq_avx(auVar86,ZEXT416(uVar73));
            auVar111._8_8_ = 0;
            auVar111._0_8_ = uVar81;
            auVar97 = vpunpcklqdq_avx(auVar111,ZEXT416(uVar6));
            lVar76 = 0;
            if (uVar78 != 0) {
              for (; (uVar78 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
              }
            }
            auVar126._8_8_ = 0;
            auVar126._0_8_ = *(ulong *)(uVar77 + lVar76 * 8);
            auVar109 = vpunpcklqdq_avx(auVar126,ZEXT416(*(uint *)(local_1400 + lVar76 * 4)));
            auVar108 = vpcmpgtd_avx(auVar97,auVar86);
            uVar78 = uVar78 - 1 & uVar78;
            if (uVar78 == 0) {
              auVar110 = vpshufd_avx(auVar108,0xaa);
              auVar108 = vblendvps_avx(auVar97,auVar86,auVar110);
              auVar86 = vblendvps_avx(auVar86,auVar97,auVar110);
              auVar97 = vpcmpgtd_avx(auVar109,auVar108);
              auVar110 = vpshufd_avx(auVar97,0xaa);
              auVar97 = vblendvps_avx(auVar109,auVar108,auVar110);
              auVar108 = vblendvps_avx(auVar108,auVar109,auVar110);
              auVar109 = vpcmpgtd_avx(auVar108,auVar86);
              auVar110 = vpshufd_avx(auVar109,0xaa);
              auVar109 = vblendvps_avx(auVar108,auVar86,auVar110);
              auVar86 = vblendvps_avx(auVar86,auVar108,auVar110);
              *pauVar74 = auVar86;
              pauVar74[1] = auVar109;
              uVar79 = auVar97._0_8_;
              pauVar74 = pauVar74 + 2;
            }
            else {
              lVar76 = 0;
              if (uVar78 != 0) {
                for (; (uVar78 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
                }
              }
              auVar140._8_8_ = 0;
              auVar140._0_8_ = *(ulong *)(uVar77 + lVar76 * 8);
              auVar124 = vpunpcklqdq_avx(auVar140,ZEXT416(*(uint *)(local_1400 + lVar76 * 4)));
              auVar110 = vpshufd_avx(auVar108,0xaa);
              auVar108 = vblendvps_avx(auVar97,auVar86,auVar110);
              auVar86 = vblendvps_avx(auVar86,auVar97,auVar110);
              auVar97 = vpcmpgtd_avx(auVar124,auVar109);
              auVar110 = vpshufd_avx(auVar97,0xaa);
              auVar97 = vblendvps_avx(auVar124,auVar109,auVar110);
              auVar109 = vblendvps_avx(auVar109,auVar124,auVar110);
              auVar110 = vpcmpgtd_avx(auVar109,auVar86);
              auVar124 = vpshufd_avx(auVar110,0xaa);
              auVar110 = vblendvps_avx(auVar109,auVar86,auVar124);
              auVar86 = vblendvps_avx(auVar86,auVar109,auVar124);
              auVar109 = vpcmpgtd_avx(auVar97,auVar108);
              auVar124 = vpshufd_avx(auVar109,0xaa);
              auVar109 = vblendvps_avx(auVar97,auVar108,auVar124);
              auVar97 = vblendvps_avx(auVar108,auVar97,auVar124);
              auVar108 = vpcmpgtd_avx(auVar110,auVar97);
              auVar124 = vpshufd_avx(auVar108,0xaa);
              auVar108 = vblendvps_avx(auVar110,auVar97,auVar124);
              auVar97 = vblendvps_avx(auVar97,auVar110,auVar124);
              *pauVar74 = auVar86;
              pauVar74[1] = auVar97;
              pauVar74[2] = auVar108;
              auVar148 = ZEXT1664(local_14f0);
              uVar79 = auVar109._0_8_;
              pauVar74 = pauVar74 + 3;
            }
          }
        }
      }
      uVar77 = (ulong)((uint)uVar79 & 0xf);
      if (uVar77 != 8) {
        uVar79 = uVar79 & 0xfffffffffffffff0;
        lVar76 = 0;
        do {
          lVar75 = lVar76 * 0x60;
          pSVar7 = context->scene;
          ppfVar8 = (pSVar7->vertices).items;
          pfVar9 = ppfVar8[*(uint *)(uVar79 + 0x40 + lVar75)];
          pfVar10 = ppfVar8[*(uint *)(uVar79 + 0x44 + lVar75)];
          pfVar11 = ppfVar8[*(uint *)(uVar79 + 0x48 + lVar75)];
          pfVar12 = ppfVar8[*(uint *)(uVar79 + 0x4c + lVar75)];
          auVar108 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar79 + lVar75)),
                                   *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar79 + 8 + lVar75)))
          ;
          auVar86 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar79 + lVar75)),
                                  *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar79 + 8 + lVar75)));
          auVar109 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar79 + 4 + lVar75)),
                                   *(undefined1 (*) [16])
                                    (pfVar12 + *(uint *)(uVar79 + 0xc + lVar75)));
          auVar97 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar79 + 4 + lVar75)),
                                  *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar79 + 0xc + lVar75))
                                 );
          auVar124 = vunpcklps_avx(auVar86,auVar97);
          auVar125 = vunpcklps_avx(auVar108,auVar109);
          auVar86 = vunpckhps_avx(auVar108,auVar109);
          auVar109 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar79 + 0x10 + lVar75)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar79 + 0x18 + lVar75)));
          auVar97 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar79 + 0x10 + lVar75))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar79 + 0x18 + lVar75)));
          auVar110 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar79 + 0x14 + lVar75)),
                                   *(undefined1 (*) [16])
                                    (pfVar12 + *(uint *)(uVar79 + 0x1c + lVar75)));
          auVar108 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar79 + 0x14 + lVar75)),
                                   *(undefined1 (*) [16])
                                    (pfVar12 + *(uint *)(uVar79 + 0x1c + lVar75)));
          auVar111 = vunpcklps_avx(auVar97,auVar108);
          auVar126 = vunpcklps_avx(auVar109,auVar110);
          auVar97 = vunpckhps_avx(auVar109,auVar110);
          auVar110 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar79 + 0x20 + lVar75)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar79 + 0x28 + lVar75)));
          auVar108 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar79 + 0x20 + lVar75)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar79 + 0x28 + lVar75)));
          auVar140 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar79 + 0x24 + lVar75)),
                                   *(undefined1 (*) [16])
                                    (pfVar12 + *(uint *)(uVar79 + 0x2c + lVar75)));
          auVar109 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar79 + 0x24 + lVar75)),
                                   *(undefined1 (*) [16])
                                    (pfVar12 + *(uint *)(uVar79 + 0x2c + lVar75)));
          auVar40 = vunpcklps_avx(auVar108,auVar109);
          auVar41 = vunpcklps_avx(auVar110,auVar140);
          auVar108 = vunpckhps_avx(auVar110,auVar140);
          auVar140 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar79 + 0x30 + lVar75)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar79 + 0x38 + lVar75)));
          auVar109 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar79 + 0x30 + lVar75)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar79 + 0x38 + lVar75)));
          auVar42 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar79 + 0x34 + lVar75)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar79 + 0x3c + lVar75)));
          auVar110 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar79 + 0x34 + lVar75)),
                                   *(undefined1 (*) [16])
                                    (pfVar12 + *(uint *)(uVar79 + 0x3c + lVar75)));
          auVar110 = vunpcklps_avx(auVar109,auVar110);
          auVar43 = vunpcklps_avx(auVar140,auVar42);
          lVar1 = uVar79 + 0x40 + lVar75;
          local_10e0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_10d8 = *(undefined8 *)(lVar1 + 0x18);
          auVar109 = vunpckhps_avx(auVar140,auVar42);
          uStack_10d0 = local_10e0;
          uStack_10c8 = uStack_10d8;
          lVar75 = uVar79 + 0x50 + lVar75;
          local_1420 = *(undefined8 *)(lVar75 + 0x10);
          uStack_1418 = *(undefined8 *)(lVar75 + 0x18);
          uStack_1410 = local_1420;
          uStack_1408 = uStack_1418;
          auVar141._16_16_ = auVar41;
          auVar141._0_16_ = auVar125;
          auVar155._16_16_ = auVar108;
          auVar155._0_16_ = auVar86;
          auVar98._16_16_ = auVar40;
          auVar98._0_16_ = auVar124;
          auVar145._16_16_ = auVar126;
          auVar145._0_16_ = auVar126;
          auVar174._16_16_ = auVar97;
          auVar174._0_16_ = auVar97;
          auVar188._16_16_ = auVar111;
          auVar188._0_16_ = auVar111;
          auVar184._16_16_ = auVar43;
          auVar184._0_16_ = auVar43;
          auVar159._16_16_ = auVar109;
          auVar159._0_16_ = auVar109;
          auVar127._16_16_ = auVar110;
          auVar127._0_16_ = auVar110;
          uVar2 = *(undefined4 *)(ray + k * 4);
          auVar198._4_4_ = uVar2;
          auVar198._0_4_ = uVar2;
          auVar198._8_4_ = uVar2;
          auVar198._12_4_ = uVar2;
          auVar198._16_4_ = uVar2;
          auVar198._20_4_ = uVar2;
          auVar198._24_4_ = uVar2;
          auVar198._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar214._4_4_ = uVar2;
          auVar214._0_4_ = uVar2;
          auVar214._8_4_ = uVar2;
          auVar214._12_4_ = uVar2;
          auVar214._16_4_ = uVar2;
          auVar214._20_4_ = uVar2;
          auVar214._24_4_ = uVar2;
          auVar214._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar217._4_4_ = uVar2;
          auVar217._0_4_ = uVar2;
          auVar217._8_4_ = uVar2;
          auVar217._12_4_ = uVar2;
          auVar217._16_4_ = uVar2;
          auVar217._20_4_ = uVar2;
          auVar217._24_4_ = uVar2;
          auVar217._28_4_ = uVar2;
          local_1100 = vsubps_avx(auVar141,auVar198);
          local_1120 = vsubps_avx(auVar155,auVar214);
          local_1140 = vsubps_avx(auVar98,auVar217);
          auVar87 = vsubps_avx(auVar145,auVar198);
          auVar112 = vsubps_avx(auVar174,auVar214);
          auVar33 = vsubps_avx(auVar188,auVar217);
          auVar34 = vsubps_avx(auVar184,auVar198);
          auVar35 = vsubps_avx(auVar159,auVar214);
          auVar36 = vsubps_avx(auVar127,auVar217);
          local_1160 = vsubps_avx(auVar34,local_1100);
          local_1180 = vsubps_avx(auVar35,local_1120);
          local_11a0 = vsubps_avx(auVar36,local_1140);
          fVar3 = local_1120._0_4_;
          fVar95 = auVar35._0_4_ + fVar3;
          fVar16 = local_1120._4_4_;
          fVar102 = auVar35._4_4_ + fVar16;
          fVar119 = local_1120._8_4_;
          fVar103 = auVar35._8_4_ + fVar119;
          fVar122 = local_1120._12_4_;
          fVar104 = auVar35._12_4_ + fVar122;
          fVar19 = local_1120._16_4_;
          fVar105 = auVar35._16_4_ + fVar19;
          fVar22 = local_1120._20_4_;
          fVar106 = auVar35._20_4_ + fVar22;
          fVar25 = local_1120._24_4_;
          fVar107 = auVar35._24_4_ + fVar25;
          fVar96 = local_1120._28_4_;
          fVar14 = local_1140._0_4_;
          fVar157 = auVar36._0_4_ + fVar14;
          fVar17 = local_1140._4_4_;
          fVar161 = auVar36._4_4_ + fVar17;
          fVar120 = local_1140._8_4_;
          fVar163 = auVar36._8_4_ + fVar120;
          fVar123 = local_1140._12_4_;
          fVar165 = auVar36._12_4_ + fVar123;
          fVar20 = local_1140._16_4_;
          fVar167 = auVar36._16_4_ + fVar20;
          fVar23 = local_1140._20_4_;
          fVar169 = auVar36._20_4_ + fVar23;
          fVar26 = local_1140._24_4_;
          fVar171 = auVar36._24_4_ + fVar26;
          fVar28 = local_11a0._0_4_;
          fVar30 = local_11a0._4_4_;
          auVar37._4_4_ = fVar102 * fVar30;
          auVar37._0_4_ = fVar95 * fVar28;
          fVar32 = local_11a0._8_4_;
          auVar37._8_4_ = fVar103 * fVar32;
          fVar92 = local_11a0._12_4_;
          auVar37._12_4_ = fVar104 * fVar92;
          fVar93 = local_11a0._16_4_;
          auVar37._16_4_ = fVar105 * fVar93;
          fVar94 = local_11a0._20_4_;
          auVar37._20_4_ = fVar106 * fVar94;
          fVar143 = local_11a0._24_4_;
          auVar37._24_4_ = fVar107 * fVar143;
          auVar37._28_4_ = auVar97._12_4_;
          fVar196 = local_1180._0_4_;
          fVar200 = local_1180._4_4_;
          auVar38._4_4_ = fVar200 * fVar161;
          auVar38._0_4_ = fVar196 * fVar157;
          fVar202 = local_1180._8_4_;
          auVar38._8_4_ = fVar202 * fVar163;
          fVar204 = local_1180._12_4_;
          auVar38._12_4_ = fVar204 * fVar165;
          fVar206 = local_1180._16_4_;
          auVar38._16_4_ = fVar206 * fVar167;
          fVar208 = local_1180._20_4_;
          auVar38._20_4_ = fVar208 * fVar169;
          fVar210 = local_1180._24_4_;
          auVar38._24_4_ = fVar210 * fVar171;
          auVar38._28_4_ = auVar43._12_4_;
          auVar37 = vsubps_avx(auVar38,auVar37);
          fVar15 = local_1100._0_4_;
          fVar173 = auVar34._0_4_ + fVar15;
          fVar118 = local_1100._4_4_;
          fVar178 = auVar34._4_4_ + fVar118;
          fVar121 = local_1100._8_4_;
          fVar179 = auVar34._8_4_ + fVar121;
          fVar18 = local_1100._12_4_;
          fVar180 = auVar34._12_4_ + fVar18;
          fVar21 = local_1100._16_4_;
          fVar181 = auVar34._16_4_ + fVar21;
          fVar24 = local_1100._20_4_;
          fVar182 = auVar34._20_4_ + fVar24;
          fVar27 = local_1100._24_4_;
          fVar183 = auVar34._24_4_ + fVar27;
          fVar29 = local_1160._0_4_;
          fVar31 = local_1160._4_4_;
          auVar39._4_4_ = fVar161 * fVar31;
          auVar39._0_4_ = fVar157 * fVar29;
          fVar157 = local_1160._8_4_;
          auVar39._8_4_ = fVar163 * fVar157;
          fVar161 = local_1160._12_4_;
          auVar39._12_4_ = fVar165 * fVar161;
          fVar163 = local_1160._16_4_;
          auVar39._16_4_ = fVar167 * fVar163;
          fVar165 = local_1160._20_4_;
          auVar39._20_4_ = fVar169 * fVar165;
          fVar167 = local_1160._24_4_;
          auVar39._24_4_ = fVar171 * fVar167;
          auVar39._28_4_ = auVar36._28_4_ + local_1140._28_4_;
          auVar44._4_4_ = fVar178 * fVar30;
          auVar44._0_4_ = fVar173 * fVar28;
          auVar44._8_4_ = fVar179 * fVar32;
          auVar44._12_4_ = fVar180 * fVar92;
          auVar44._16_4_ = fVar181 * fVar93;
          auVar44._20_4_ = fVar182 * fVar94;
          auVar44._24_4_ = fVar183 * fVar143;
          auVar44._28_4_ = auVar43._12_4_;
          auVar38 = vsubps_avx(auVar44,auVar39);
          auVar44 = local_1180;
          auVar45._4_4_ = fVar178 * fVar200;
          auVar45._0_4_ = fVar173 * fVar196;
          auVar45._8_4_ = fVar179 * fVar202;
          auVar45._12_4_ = fVar180 * fVar204;
          auVar45._16_4_ = fVar181 * fVar206;
          auVar45._20_4_ = fVar182 * fVar208;
          auVar45._24_4_ = fVar183 * fVar210;
          auVar45._28_4_ = auVar34._28_4_ + local_1100._28_4_;
          auVar46._4_4_ = fVar31 * fVar102;
          auVar46._0_4_ = fVar29 * fVar95;
          auVar46._8_4_ = fVar157 * fVar103;
          auVar46._12_4_ = fVar161 * fVar104;
          auVar46._16_4_ = fVar163 * fVar105;
          auVar46._20_4_ = fVar165 * fVar106;
          auVar46._24_4_ = fVar167 * fVar107;
          auVar46._28_4_ = auVar35._28_4_ + fVar96;
          auVar39 = vsubps_avx(auVar46,auVar45);
          fVar95 = *(float *)(ray + k * 4 + 0xa0);
          fVar102 = *(float *)(ray + k * 4 + 0xc0);
          fStack_14d8 = *(float *)(ray + k * 4 + 0x80);
          local_14e0 = (Geometry *)CONCAT44(fStack_14d8,fStack_14d8);
          auVar185._0_4_ =
               auVar37._0_4_ * fStack_14d8 + fVar95 * auVar38._0_4_ + auVar39._0_4_ * fVar102;
          auVar185._4_4_ =
               auVar37._4_4_ * fStack_14d8 + fVar95 * auVar38._4_4_ + auVar39._4_4_ * fVar102;
          auVar185._8_4_ =
               auVar37._8_4_ * fStack_14d8 + fVar95 * auVar38._8_4_ + auVar39._8_4_ * fVar102;
          auVar185._12_4_ =
               auVar37._12_4_ * fStack_14d8 + fVar95 * auVar38._12_4_ + auVar39._12_4_ * fVar102;
          auVar185._16_4_ =
               auVar37._16_4_ * fStack_14d8 + fVar95 * auVar38._16_4_ + auVar39._16_4_ * fVar102;
          auVar185._20_4_ =
               auVar37._20_4_ * fStack_14d8 + fVar95 * auVar38._20_4_ + auVar39._20_4_ * fVar102;
          auVar185._24_4_ =
               auVar37._24_4_ * fStack_14d8 + fVar95 * auVar38._24_4_ + auVar39._24_4_ * fVar102;
          auVar185._28_4_ = auVar38._28_4_ + auVar38._28_4_ + auVar39._28_4_;
          local_11c0 = vsubps_avx(local_1120,auVar112);
          auVar38 = vsubps_avx(local_1140,auVar33);
          fVar104 = fVar3 + auVar112._0_4_;
          fVar105 = fVar16 + auVar112._4_4_;
          fVar106 = fVar119 + auVar112._8_4_;
          fVar107 = fVar122 + auVar112._12_4_;
          fVar169 = fVar19 + auVar112._16_4_;
          fVar171 = fVar22 + auVar112._20_4_;
          fVar173 = fVar25 + auVar112._24_4_;
          fVar103 = auVar112._28_4_;
          fVar178 = auVar33._0_4_ + fVar14;
          fVar179 = auVar33._4_4_ + fVar17;
          fVar180 = auVar33._8_4_ + fVar120;
          fVar181 = auVar33._12_4_ + fVar123;
          fVar182 = auVar33._16_4_ + fVar20;
          fVar183 = auVar33._20_4_ + fVar23;
          fVar133 = auVar33._24_4_ + fVar26;
          fVar158 = auVar38._0_4_;
          fVar162 = auVar38._4_4_;
          auVar47._4_4_ = fVar162 * fVar105;
          auVar47._0_4_ = fVar158 * fVar104;
          fVar164 = auVar38._8_4_;
          auVar47._8_4_ = fVar164 * fVar106;
          fVar166 = auVar38._12_4_;
          auVar47._12_4_ = fVar166 * fVar107;
          fVar168 = auVar38._16_4_;
          auVar47._16_4_ = fVar168 * fVar169;
          fVar170 = auVar38._20_4_;
          auVar47._20_4_ = fVar170 * fVar171;
          fVar172 = auVar38._24_4_;
          auVar47._24_4_ = fVar172 * fVar173;
          auVar47._28_4_ = auVar37._28_4_;
          fVar187 = local_11c0._0_4_;
          fVar190 = local_11c0._4_4_;
          auVar48._4_4_ = fVar190 * fVar179;
          auVar48._0_4_ = fVar187 * fVar178;
          fVar191 = local_11c0._8_4_;
          auVar48._8_4_ = fVar191 * fVar180;
          fVar192 = local_11c0._12_4_;
          auVar48._12_4_ = fVar192 * fVar181;
          fVar193 = local_11c0._16_4_;
          auVar48._16_4_ = fVar193 * fVar182;
          fVar194 = local_11c0._20_4_;
          auVar48._20_4_ = fVar194 * fVar183;
          fVar195 = local_11c0._24_4_;
          auVar48._24_4_ = fVar195 * fVar133;
          auVar48._28_4_ = fVar96;
          auVar37 = vsubps_avx(auVar48,auVar47);
          auVar38 = vsubps_avx(local_1100,auVar87);
          fVar216 = auVar38._0_4_;
          fVar219 = auVar38._4_4_;
          auVar49._4_4_ = fVar219 * fVar179;
          auVar49._0_4_ = fVar216 * fVar178;
          fVar220 = auVar38._8_4_;
          auVar49._8_4_ = fVar220 * fVar180;
          fVar221 = auVar38._12_4_;
          auVar49._12_4_ = fVar221 * fVar181;
          fVar222 = auVar38._16_4_;
          auVar49._16_4_ = fVar222 * fVar182;
          fVar223 = auVar38._20_4_;
          auVar49._20_4_ = fVar223 * fVar183;
          fVar224 = auVar38._24_4_;
          auVar49._24_4_ = fVar224 * fVar133;
          auVar49._28_4_ = auVar33._28_4_ + local_1140._28_4_;
          fVar178 = auVar87._0_4_ + fVar15;
          fVar179 = auVar87._4_4_ + fVar118;
          fVar180 = auVar87._8_4_ + fVar121;
          fVar181 = auVar87._12_4_ + fVar18;
          fVar182 = auVar87._16_4_ + fVar21;
          fVar183 = auVar87._20_4_ + fVar24;
          fVar133 = auVar87._24_4_ + fVar27;
          fVar212 = auVar87._28_4_;
          auVar50._4_4_ = fVar179 * fVar162;
          auVar50._0_4_ = fVar178 * fVar158;
          auVar50._8_4_ = fVar180 * fVar164;
          auVar50._12_4_ = fVar181 * fVar166;
          auVar50._16_4_ = fVar182 * fVar168;
          auVar50._20_4_ = fVar183 * fVar170;
          auVar50._24_4_ = fVar133 * fVar172;
          auVar50._28_4_ = fVar212;
          auVar38 = vsubps_avx(auVar50,auVar49);
          auVar51._4_4_ = fVar179 * fVar190;
          auVar51._0_4_ = fVar178 * fVar187;
          auVar51._8_4_ = fVar180 * fVar191;
          auVar51._12_4_ = fVar181 * fVar192;
          auVar51._16_4_ = fVar182 * fVar193;
          auVar51._20_4_ = fVar183 * fVar194;
          auVar51._24_4_ = fVar133 * fVar195;
          auVar51._28_4_ = fVar212 + local_1100._28_4_;
          auVar52._4_4_ = fVar219 * fVar105;
          auVar52._0_4_ = fVar216 * fVar104;
          auVar52._8_4_ = fVar220 * fVar106;
          auVar52._12_4_ = fVar221 * fVar107;
          auVar52._16_4_ = fVar222 * fVar169;
          auVar52._20_4_ = fVar223 * fVar171;
          auVar52._24_4_ = fVar224 * fVar173;
          auVar52._28_4_ = fVar96 + fVar103;
          auVar39 = vsubps_avx(auVar52,auVar51);
          local_13e0._0_4_ =
               fStack_14d8 * auVar37._0_4_ + auVar39._0_4_ * fVar102 + fVar95 * auVar38._0_4_;
          local_13e0._4_4_ =
               fStack_14d8 * auVar37._4_4_ + auVar39._4_4_ * fVar102 + fVar95 * auVar38._4_4_;
          local_13e0._8_4_ =
               fStack_14d8 * auVar37._8_4_ + auVar39._8_4_ * fVar102 + fVar95 * auVar38._8_4_;
          local_13e0._12_4_ =
               fStack_14d8 * auVar37._12_4_ + auVar39._12_4_ * fVar102 + fVar95 * auVar38._12_4_;
          local_13e0._16_4_ =
               fStack_14d8 * auVar37._16_4_ + auVar39._16_4_ * fVar102 + fVar95 * auVar38._16_4_;
          local_13e0._20_4_ =
               fStack_14d8 * auVar37._20_4_ + auVar39._20_4_ * fVar102 + fVar95 * auVar38._20_4_;
          local_13e0._24_4_ =
               fStack_14d8 * auVar37._24_4_ + auVar39._24_4_ * fVar102 + fVar95 * auVar38._24_4_;
          local_13e0._28_4_ = auVar38._28_4_ + auVar39._28_4_ + auVar38._28_4_;
          auVar37 = vsubps_avx(auVar87,auVar34);
          fVar171 = auVar87._0_4_ + auVar34._0_4_;
          fVar173 = auVar87._4_4_ + auVar34._4_4_;
          fVar178 = auVar87._8_4_ + auVar34._8_4_;
          fVar179 = auVar87._12_4_ + auVar34._12_4_;
          fVar180 = auVar87._16_4_ + auVar34._16_4_;
          fVar181 = auVar87._20_4_ + auVar34._20_4_;
          fVar182 = auVar87._24_4_ + auVar34._24_4_;
          auVar87 = vsubps_avx(auVar112,auVar35);
          fVar183 = auVar35._0_4_ + auVar112._0_4_;
          fVar133 = auVar35._4_4_ + auVar112._4_4_;
          fVar129 = auVar35._8_4_ + auVar112._8_4_;
          fVar130 = auVar35._12_4_ + auVar112._12_4_;
          fVar131 = auVar35._16_4_ + auVar112._16_4_;
          fVar132 = auVar35._20_4_ + auVar112._20_4_;
          fVar134 = auVar35._24_4_ + auVar112._24_4_;
          fVar135 = auVar35._28_4_ + fVar103;
          auVar112 = vsubps_avx(auVar33,auVar36);
          fVar104 = auVar33._0_4_ + auVar36._0_4_;
          fVar105 = auVar33._4_4_ + auVar36._4_4_;
          fVar106 = auVar33._8_4_ + auVar36._8_4_;
          fVar107 = auVar33._12_4_ + auVar36._12_4_;
          fVar169 = auVar33._16_4_ + auVar36._16_4_;
          fVar138 = auVar33._20_4_ + auVar36._20_4_;
          fVar139 = auVar33._24_4_ + auVar36._24_4_;
          fVar197 = auVar112._0_4_;
          fVar201 = auVar112._4_4_;
          auVar35._4_4_ = fVar201 * fVar133;
          auVar35._0_4_ = fVar197 * fVar183;
          fVar203 = auVar112._8_4_;
          auVar35._8_4_ = fVar203 * fVar129;
          fVar205 = auVar112._12_4_;
          auVar35._12_4_ = fVar205 * fVar130;
          fVar207 = auVar112._16_4_;
          auVar35._16_4_ = fVar207 * fVar131;
          fVar209 = auVar112._20_4_;
          auVar35._20_4_ = fVar209 * fVar132;
          fVar211 = auVar112._24_4_;
          auVar35._24_4_ = fVar211 * fVar134;
          auVar35._28_4_ = fVar103;
          fVar144 = auVar87._0_4_;
          fVar149 = auVar87._4_4_;
          auVar53._4_4_ = fVar149 * fVar105;
          auVar53._0_4_ = fVar144 * fVar104;
          fVar150 = auVar87._8_4_;
          auVar53._8_4_ = fVar150 * fVar106;
          fVar151 = auVar87._12_4_;
          auVar53._12_4_ = fVar151 * fVar107;
          fVar152 = auVar87._16_4_;
          auVar53._16_4_ = fVar152 * fVar169;
          fVar153 = auVar87._20_4_;
          auVar53._20_4_ = fVar153 * fVar138;
          fVar154 = auVar87._24_4_;
          uVar2 = auVar87._28_4_;
          auVar53._24_4_ = fVar154 * fVar139;
          auVar53._28_4_ = uVar2;
          auVar87 = vsubps_avx(auVar53,auVar35);
          fVar96 = auVar37._0_4_;
          fVar103 = auVar37._4_4_;
          auVar54._4_4_ = fVar103 * fVar105;
          auVar54._0_4_ = fVar96 * fVar104;
          fVar104 = auVar37._8_4_;
          auVar54._8_4_ = fVar104 * fVar106;
          fVar105 = auVar37._12_4_;
          auVar54._12_4_ = fVar105 * fVar107;
          fVar106 = auVar37._16_4_;
          auVar54._16_4_ = fVar106 * fVar169;
          fVar107 = auVar37._20_4_;
          auVar54._20_4_ = fVar107 * fVar138;
          fVar169 = auVar37._24_4_;
          auVar54._24_4_ = fVar169 * fVar139;
          auVar54._28_4_ = auVar33._28_4_ + auVar36._28_4_;
          auVar33._4_4_ = fVar201 * fVar173;
          auVar33._0_4_ = fVar197 * fVar171;
          auVar33._8_4_ = fVar203 * fVar178;
          auVar33._12_4_ = fVar205 * fVar179;
          auVar33._16_4_ = fVar207 * fVar180;
          auVar33._20_4_ = fVar209 * fVar181;
          auVar33._24_4_ = fVar211 * fVar182;
          auVar33._28_4_ = uVar2;
          auVar112 = vsubps_avx(auVar33,auVar54);
          auVar36._4_4_ = fVar173 * fVar149;
          auVar36._0_4_ = fVar171 * fVar144;
          auVar36._8_4_ = fVar178 * fVar150;
          auVar36._12_4_ = fVar179 * fVar151;
          auVar36._16_4_ = fVar180 * fVar152;
          auVar36._20_4_ = fVar181 * fVar153;
          auVar36._24_4_ = fVar182 * fVar154;
          auVar36._28_4_ = fVar212 + auVar34._28_4_;
          auVar34._4_4_ = fVar103 * fVar133;
          auVar34._0_4_ = fVar96 * fVar183;
          auVar34._8_4_ = fVar104 * fVar129;
          auVar34._12_4_ = fVar105 * fVar130;
          auVar34._16_4_ = fVar106 * fVar131;
          auVar34._20_4_ = fVar107 * fVar132;
          auVar34._24_4_ = fVar169 * fVar134;
          auVar34._28_4_ = fVar135;
          auVar33 = vsubps_avx(auVar34,auVar36);
          auVar113._0_4_ =
               fStack_14d8 * auVar87._0_4_ + auVar33._0_4_ * fVar102 + fVar95 * auVar112._0_4_;
          auVar113._4_4_ =
               fStack_14d8 * auVar87._4_4_ + auVar33._4_4_ * fVar102 + fVar95 * auVar112._4_4_;
          auVar113._8_4_ =
               fStack_14d8 * auVar87._8_4_ + auVar33._8_4_ * fVar102 + fVar95 * auVar112._8_4_;
          auVar113._12_4_ =
               fStack_14d8 * auVar87._12_4_ + auVar33._12_4_ * fVar102 + fVar95 * auVar112._12_4_;
          auVar113._16_4_ =
               fStack_14d8 * auVar87._16_4_ + auVar33._16_4_ * fVar102 + fVar95 * auVar112._16_4_;
          auVar113._20_4_ =
               fStack_14d8 * auVar87._20_4_ + auVar33._20_4_ * fVar102 + fVar95 * auVar112._20_4_;
          auVar113._24_4_ =
               fStack_14d8 * auVar87._24_4_ + auVar33._24_4_ * fVar102 + fVar95 * auVar112._24_4_;
          auVar113._28_4_ = fVar135 + auVar33._28_4_ + fVar135;
          local_1200._0_4_ = auVar113._0_4_ + auVar185._0_4_ + local_13e0._0_4_;
          local_1200._4_4_ = auVar113._4_4_ + auVar185._4_4_ + local_13e0._4_4_;
          local_1200._8_4_ = auVar113._8_4_ + auVar185._8_4_ + local_13e0._8_4_;
          local_1200._12_4_ = auVar113._12_4_ + auVar185._12_4_ + local_13e0._12_4_;
          local_1200._16_4_ = auVar113._16_4_ + auVar185._16_4_ + local_13e0._16_4_;
          local_1200._20_4_ = auVar113._20_4_ + auVar185._20_4_ + local_13e0._20_4_;
          local_1200._24_4_ = auVar113._24_4_ + auVar185._24_4_ + local_13e0._24_4_;
          local_1200._28_4_ = auVar113._28_4_ + auVar185._28_4_ + local_13e0._28_4_;
          auVar87 = vminps_avx(auVar185,local_13e0);
          auVar87 = vminps_avx(auVar87,auVar113);
          auVar136._8_4_ = 0x7fffffff;
          auVar136._0_8_ = 0x7fffffff7fffffff;
          auVar136._12_4_ = 0x7fffffff;
          auVar136._16_4_ = 0x7fffffff;
          auVar136._20_4_ = 0x7fffffff;
          auVar136._24_4_ = 0x7fffffff;
          auVar136._28_4_ = 0x7fffffff;
          local_11e0 = vandps_avx(local_1200,auVar136);
          fVar171 = local_11e0._0_4_ * 1.1920929e-07;
          fVar173 = local_11e0._4_4_ * 1.1920929e-07;
          auVar55._4_4_ = fVar173;
          auVar55._0_4_ = fVar171;
          fVar178 = local_11e0._8_4_ * 1.1920929e-07;
          auVar55._8_4_ = fVar178;
          fVar179 = local_11e0._12_4_ * 1.1920929e-07;
          auVar55._12_4_ = fVar179;
          fVar180 = local_11e0._16_4_ * 1.1920929e-07;
          auVar55._16_4_ = fVar180;
          fVar181 = local_11e0._20_4_ * 1.1920929e-07;
          auVar55._20_4_ = fVar181;
          fVar182 = local_11e0._24_4_ * 1.1920929e-07;
          auVar55._24_4_ = fVar182;
          auVar55._28_4_ = 0x34000000;
          auVar142._0_8_ = CONCAT44(fVar173,fVar171) ^ 0x8000000080000000;
          auVar142._8_4_ = -fVar178;
          auVar142._12_4_ = -fVar179;
          auVar142._16_4_ = -fVar180;
          auVar142._20_4_ = -fVar181;
          auVar142._24_4_ = -fVar182;
          auVar142._28_4_ = 0xb4000000;
          auVar87 = vcmpps_avx(auVar87,auVar142,5);
          auVar33 = vmaxps_avx(auVar185,local_13e0);
          auVar112 = vmaxps_avx(auVar33,auVar113);
          auVar112 = vcmpps_avx(auVar112,auVar55,2);
          auVar112 = vorps_avx(auVar87,auVar112);
          if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar112 >> 0x7f,0) != '\0') ||
                (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar112 >> 0xbf,0) != '\0') ||
              (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar112[0x1f] < '\0') {
            auVar56._4_4_ = fVar190 * fVar30;
            auVar56._0_4_ = fVar187 * fVar28;
            auVar56._8_4_ = fVar191 * fVar32;
            auVar56._12_4_ = fVar192 * fVar92;
            auVar56._16_4_ = fVar193 * fVar93;
            auVar56._20_4_ = fVar194 * fVar94;
            auVar56._24_4_ = fVar195 * fVar143;
            auVar56._28_4_ = auVar87._28_4_;
            auVar57._4_4_ = fVar200 * fVar162;
            auVar57._0_4_ = fVar196 * fVar158;
            auVar57._8_4_ = fVar202 * fVar164;
            auVar57._12_4_ = fVar204 * fVar166;
            auVar57._16_4_ = fVar206 * fVar168;
            auVar57._20_4_ = fVar208 * fVar170;
            auVar57._24_4_ = fVar210 * fVar172;
            auVar57._28_4_ = 0x34000000;
            auVar34 = vsubps_avx(auVar57,auVar56);
            auVar58._4_4_ = fVar162 * fVar149;
            auVar58._0_4_ = fVar158 * fVar144;
            auVar58._8_4_ = fVar164 * fVar150;
            auVar58._12_4_ = fVar166 * fVar151;
            auVar58._16_4_ = fVar168 * fVar152;
            auVar58._20_4_ = fVar170 * fVar153;
            auVar58._24_4_ = fVar172 * fVar154;
            auVar58._28_4_ = auVar33._28_4_;
            auVar59._4_4_ = fVar190 * fVar201;
            auVar59._0_4_ = fVar187 * fVar197;
            auVar59._8_4_ = fVar191 * fVar203;
            auVar59._12_4_ = fVar192 * fVar205;
            auVar59._16_4_ = fVar193 * fVar207;
            auVar59._20_4_ = fVar194 * fVar209;
            auVar59._24_4_ = fVar195 * fVar211;
            auVar59._28_4_ = uVar2;
            auVar35 = vsubps_avx(auVar59,auVar58);
            auVar175._8_4_ = 0x7fffffff;
            auVar175._0_8_ = 0x7fffffff7fffffff;
            auVar175._12_4_ = 0x7fffffff;
            auVar175._16_4_ = 0x7fffffff;
            auVar175._20_4_ = 0x7fffffff;
            auVar175._24_4_ = 0x7fffffff;
            auVar175._28_4_ = 0x7fffffff;
            auVar87 = vandps_avx(auVar175,auVar56);
            auVar33 = vandps_avx(auVar175,auVar58);
            auVar87 = vcmpps_avx(auVar87,auVar33,1);
            local_13a0 = vblendvps_avx(auVar35,auVar34,auVar87);
            auVar60._4_4_ = fVar219 * fVar201;
            auVar60._0_4_ = fVar216 * fVar197;
            auVar60._8_4_ = fVar220 * fVar203;
            auVar60._12_4_ = fVar221 * fVar205;
            auVar60._16_4_ = fVar222 * fVar207;
            auVar60._20_4_ = fVar223 * fVar209;
            auVar60._24_4_ = fVar224 * fVar211;
            auVar60._28_4_ = auVar87._28_4_;
            auVar61._4_4_ = fVar219 * fVar30;
            auVar61._0_4_ = fVar216 * fVar28;
            auVar61._8_4_ = fVar220 * fVar32;
            auVar61._12_4_ = fVar221 * fVar92;
            auVar61._16_4_ = fVar222 * fVar93;
            auVar61._20_4_ = fVar223 * fVar94;
            auVar61._24_4_ = fVar224 * fVar143;
            auVar61._28_4_ = auVar34._28_4_;
            auVar62._4_4_ = fVar162 * fVar31;
            auVar62._0_4_ = fVar158 * fVar29;
            auVar62._8_4_ = fVar164 * fVar157;
            auVar62._12_4_ = fVar166 * fVar161;
            auVar62._16_4_ = fVar168 * fVar163;
            auVar62._20_4_ = fVar170 * fVar165;
            auVar62._24_4_ = fVar172 * fVar167;
            auVar62._28_4_ = auVar33._28_4_;
            auVar34 = vsubps_avx(auVar61,auVar62);
            auVar63._4_4_ = fVar162 * fVar103;
            auVar63._0_4_ = fVar158 * fVar96;
            auVar63._8_4_ = fVar164 * fVar104;
            auVar63._12_4_ = fVar166 * fVar105;
            auVar63._16_4_ = fVar168 * fVar106;
            auVar63._20_4_ = fVar170 * fVar107;
            auVar63._24_4_ = fVar172 * fVar169;
            auVar63._28_4_ = auVar35._28_4_;
            auVar35 = vsubps_avx(auVar63,auVar60);
            auVar87 = vandps_avx(auVar175,auVar62);
            auVar33 = vandps_avx(auVar175,auVar60);
            auVar87 = vcmpps_avx(auVar87,auVar33,1);
            local_1380 = vblendvps_avx(auVar35,auVar34,auVar87);
            auVar64._4_4_ = fVar190 * fVar103;
            auVar64._0_4_ = fVar187 * fVar96;
            auVar64._8_4_ = fVar191 * fVar104;
            auVar64._12_4_ = fVar192 * fVar105;
            auVar64._16_4_ = fVar193 * fVar106;
            auVar64._20_4_ = fVar194 * fVar107;
            auVar64._24_4_ = fVar195 * fVar169;
            auVar64._28_4_ = auVar37._28_4_;
            auVar65._4_4_ = fVar190 * fVar31;
            auVar65._0_4_ = fVar187 * fVar29;
            auVar65._8_4_ = fVar191 * fVar157;
            auVar65._12_4_ = fVar192 * fVar161;
            auVar65._16_4_ = fVar193 * fVar163;
            auVar65._20_4_ = fVar194 * fVar165;
            auVar65._24_4_ = fVar195 * fVar167;
            auVar65._28_4_ = auVar87._28_4_;
            auVar66._4_4_ = fVar219 * fVar200;
            auVar66._0_4_ = fVar216 * fVar196;
            auVar66._8_4_ = fVar220 * fVar202;
            auVar66._12_4_ = fVar221 * fVar204;
            auVar66._16_4_ = fVar222 * fVar206;
            auVar66._20_4_ = fVar223 * fVar208;
            auVar66._24_4_ = fVar224 * fVar210;
            auVar66._28_4_ = auVar34._28_4_;
            auVar67._4_4_ = fVar219 * fVar149;
            auVar67._0_4_ = fVar216 * fVar144;
            auVar67._8_4_ = fVar220 * fVar150;
            auVar67._12_4_ = fVar221 * fVar151;
            auVar67._16_4_ = fVar222 * fVar152;
            auVar67._20_4_ = fVar223 * fVar153;
            auVar67._24_4_ = fVar224 * fVar154;
            auVar67._28_4_ = uVar2;
            auVar34 = vsubps_avx(auVar65,auVar66);
            auVar35 = vsubps_avx(auVar67,auVar64);
            auVar87 = vandps_avx(auVar175,auVar66);
            auVar33 = vandps_avx(auVar175,auVar64);
            auVar33 = vcmpps_avx(auVar87,auVar33,1);
            local_1360 = vblendvps_avx(auVar35,auVar34,auVar33);
            auVar86 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
            fVar165 = local_1360._0_4_;
            fVar143 = local_1360._4_4_;
            fVar167 = local_1360._8_4_;
            fVar104 = local_1360._12_4_;
            fVar105 = local_1360._16_4_;
            fVar106 = local_1360._20_4_;
            fVar107 = local_1360._24_4_;
            fVar169 = local_1380._0_4_;
            fVar171 = local_1380._4_4_;
            fVar173 = local_1380._8_4_;
            fVar178 = local_1380._12_4_;
            fVar179 = local_1380._16_4_;
            fVar180 = local_1380._20_4_;
            fVar181 = local_1380._24_4_;
            fVar96 = local_13a0._0_4_;
            fVar103 = local_13a0._4_4_;
            fVar28 = local_13a0._8_4_;
            fVar29 = local_13a0._12_4_;
            fVar30 = local_13a0._16_4_;
            fVar31 = local_13a0._20_4_;
            fVar32 = local_13a0._24_4_;
            fVar157 = fStack_14d8 * fVar96 + fVar165 * fVar102 + fVar169 * fVar95;
            fVar92 = fStack_14d8 * fVar103 + fVar143 * fVar102 + fVar171 * fVar95;
            fVar161 = fStack_14d8 * fVar28 + fVar167 * fVar102 + fVar173 * fVar95;
            fVar93 = fStack_14d8 * fVar29 + fVar104 * fVar102 + fVar178 * fVar95;
            fVar163 = fStack_14d8 * fVar30 + fVar105 * fVar102 + fVar179 * fVar95;
            fVar94 = fStack_14d8 * fVar31 + fVar106 * fVar102 + fVar180 * fVar95;
            fVar95 = fStack_14d8 * fVar32 + fVar107 * fVar102 + fVar181 * fVar95;
            fVar102 = auVar112._28_4_ + auVar112._28_4_ + 0.0;
            auVar88._0_4_ = fVar157 + fVar157;
            auVar88._4_4_ = fVar92 + fVar92;
            auVar88._8_4_ = fVar161 + fVar161;
            auVar88._12_4_ = fVar93 + fVar93;
            auVar88._16_4_ = fVar163 + fVar163;
            auVar88._20_4_ = fVar94 + fVar94;
            auVar88._24_4_ = fVar95 + fVar95;
            auVar88._28_4_ = fVar102 + fVar102;
            fVar157 = fVar96 * fVar15 + fVar165 * fVar14 + fVar169 * fVar3;
            fVar118 = fVar103 * fVar118 + fVar143 * fVar17 + fVar171 * fVar16;
            fVar119 = fVar28 * fVar121 + fVar167 * fVar120 + fVar173 * fVar119;
            fVar120 = fVar29 * fVar18 + fVar104 * fVar123 + fVar178 * fVar122;
            fVar121 = fVar30 * fVar21 + fVar105 * fVar20 + fVar179 * fVar19;
            fVar122 = fVar31 * fVar24 + fVar106 * fVar23 + fVar180 * fVar22;
            fVar123 = fVar32 * fVar27 + fVar107 * fVar26 + fVar181 * fVar25;
            auVar112 = vrcpps_avx(auVar88);
            fVar95 = auVar112._0_4_;
            fVar102 = auVar112._4_4_;
            auVar68._4_4_ = auVar88._4_4_ * fVar102;
            auVar68._0_4_ = auVar88._0_4_ * fVar95;
            fVar3 = auVar112._8_4_;
            auVar68._8_4_ = auVar88._8_4_ * fVar3;
            fVar14 = auVar112._12_4_;
            auVar68._12_4_ = auVar88._12_4_ * fVar14;
            fVar15 = auVar112._16_4_;
            auVar68._16_4_ = auVar88._16_4_ * fVar15;
            fVar16 = auVar112._20_4_;
            auVar68._20_4_ = auVar88._20_4_ * fVar16;
            fVar17 = auVar112._24_4_;
            auVar68._24_4_ = auVar88._24_4_ * fVar17;
            auVar68._28_4_ = auVar87._28_4_;
            auVar146._8_4_ = 0x3f800000;
            auVar146._0_8_ = 0x3f8000003f800000;
            auVar146._12_4_ = 0x3f800000;
            auVar146._16_4_ = 0x3f800000;
            auVar146._20_4_ = 0x3f800000;
            auVar146._24_4_ = 0x3f800000;
            auVar146._28_4_ = 0x3f800000;
            auVar87 = vsubps_avx(auVar146,auVar68);
            local_12e0._4_4_ = (fVar118 + fVar118) * (fVar102 + fVar102 * auVar87._4_4_);
            local_12e0._0_4_ = (fVar157 + fVar157) * (fVar95 + fVar95 * auVar87._0_4_);
            local_12e0._8_4_ = (fVar119 + fVar119) * (fVar3 + fVar3 * auVar87._8_4_);
            local_12e0._12_4_ = (fVar120 + fVar120) * (fVar14 + fVar14 * auVar87._12_4_);
            local_12e0._16_4_ = (fVar121 + fVar121) * (fVar15 + fVar15 * auVar87._16_4_);
            local_12e0._20_4_ = (fVar122 + fVar122) * (fVar16 + fVar16 * auVar87._20_4_);
            local_12e0._24_4_ = (fVar123 + fVar123) * (fVar17 + fVar17 * auVar87._24_4_);
            local_12e0._28_4_ = local_1180._28_4_;
            auVar148 = ZEXT3264(local_12e0);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar114._4_4_ = uVar2;
            auVar114._0_4_ = uVar2;
            auVar114._8_4_ = uVar2;
            auVar114._12_4_ = uVar2;
            auVar114._16_4_ = uVar2;
            auVar114._20_4_ = uVar2;
            auVar114._24_4_ = uVar2;
            auVar114._28_4_ = uVar2;
            auVar87 = vcmpps_avx(auVar114,local_12e0,2);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
            local_15e0._4_4_ = uVar2;
            local_15e0._0_4_ = uVar2;
            local_15e0._8_4_ = uVar2;
            local_15e0._12_4_ = uVar2;
            local_15e0._16_4_ = uVar2;
            local_15e0._20_4_ = uVar2;
            local_15e0._24_4_ = uVar2;
            local_15e0._28_4_ = uVar2;
            auVar112 = vcmpps_avx(local_12e0,local_15e0,2);
            auVar87 = vandps_avx(auVar112,auVar87);
            auVar97 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
            auVar86 = vpand_avx(auVar97,auVar86);
            auVar97 = vpmovsxwd_avx(auVar86);
            auVar108 = vpshufd_avx(auVar86,0xee);
            auVar108 = vpmovsxwd_avx(auVar108);
            auVar115._16_16_ = auVar108;
            auVar115._0_16_ = auVar97;
            if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar115 >> 0x7f,0) != '\0') ||
                  (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar108 >> 0x3f,0) != '\0') ||
                (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar108[0xf] < '\0') {
              auVar87 = vcmpps_avx(auVar88,_DAT_01faff00,4);
              auVar97 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
              auVar86 = vpand_avx(auVar86,auVar97);
              auVar97 = vpmovsxwd_avx(auVar86);
              auVar108 = vpunpckhwd_avx(auVar86,auVar86);
              local_1520._16_16_ = auVar108;
              local_1520._0_16_ = auVar97;
              if ((((((((local_1520 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1520 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1520 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1520 >> 0x7f,0) != '\0') ||
                    (local_1520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar108 >> 0x3f,0) != '\0') ||
                  (local_1520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar108[0xf] < '\0') {
                local_1400 = auVar185;
                local_13c0 = local_1200;
                auVar87 = vrcpps_avx(local_1200);
                fVar95 = auVar87._0_4_;
                fVar102 = auVar87._4_4_;
                auVar69._4_4_ = local_1200._4_4_ * fVar102;
                auVar69._0_4_ = local_1200._0_4_ * fVar95;
                fVar3 = auVar87._8_4_;
                auVar69._8_4_ = local_1200._8_4_ * fVar3;
                fVar14 = auVar87._12_4_;
                auVar69._12_4_ = local_1200._12_4_ * fVar14;
                fVar15 = auVar87._16_4_;
                auVar69._16_4_ = local_1200._16_4_ * fVar15;
                fVar16 = auVar87._20_4_;
                auVar69._20_4_ = local_1200._20_4_ * fVar16;
                fVar17 = auVar87._24_4_;
                auVar69._24_4_ = local_1200._24_4_ * fVar17;
                auVar69._28_4_ = 0x3f800000;
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = 0x3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar176._16_4_ = 0x3f800000;
                auVar176._20_4_ = 0x3f800000;
                auVar176._24_4_ = 0x3f800000;
                auVar176._28_4_ = 0x3f800000;
                auVar112 = vsubps_avx(auVar176,auVar69);
                auVar137._0_4_ = fVar95 + fVar95 * auVar112._0_4_;
                auVar137._4_4_ = fVar102 + fVar102 * auVar112._4_4_;
                auVar137._8_4_ = fVar3 + fVar3 * auVar112._8_4_;
                auVar137._12_4_ = fVar14 + fVar14 * auVar112._12_4_;
                auVar137._16_4_ = fVar15 + fVar15 * auVar112._16_4_;
                auVar137._20_4_ = fVar16 + fVar16 * auVar112._20_4_;
                auVar137._24_4_ = fVar17 + fVar17 * auVar112._24_4_;
                auVar137._28_4_ = auVar87._28_4_ + auVar112._28_4_;
                auVar147._8_4_ = 0x219392ef;
                auVar147._0_8_ = 0x219392ef219392ef;
                auVar147._12_4_ = 0x219392ef;
                auVar147._16_4_ = 0x219392ef;
                auVar147._20_4_ = 0x219392ef;
                auVar147._24_4_ = 0x219392ef;
                auVar147._28_4_ = 0x219392ef;
                auVar112 = vcmpps_avx(local_11e0,auVar147,5);
                auVar87 = vandps_avx(auVar112,auVar137);
                local_1340 = local_1520;
                local_1260 = local_1220;
                auVar70._4_4_ = auVar185._4_4_ * auVar87._4_4_;
                auVar70._0_4_ = auVar185._0_4_ * auVar87._0_4_;
                auVar70._8_4_ = auVar185._8_4_ * auVar87._8_4_;
                auVar70._12_4_ = auVar185._12_4_ * auVar87._12_4_;
                auVar70._16_4_ = auVar185._16_4_ * auVar87._16_4_;
                auVar70._20_4_ = auVar185._20_4_ * auVar87._20_4_;
                auVar70._24_4_ = auVar185._24_4_ * auVar87._24_4_;
                auVar70._28_4_ = auVar112._28_4_;
                auVar112 = vminps_avx(auVar70,auVar176);
                auVar71._4_4_ = local_13e0._4_4_ * auVar87._4_4_;
                auVar71._0_4_ = local_13e0._0_4_ * auVar87._0_4_;
                auVar71._8_4_ = local_13e0._8_4_ * auVar87._8_4_;
                auVar71._12_4_ = local_13e0._12_4_ * auVar87._12_4_;
                auVar71._16_4_ = local_13e0._16_4_ * auVar87._16_4_;
                auVar71._20_4_ = local_13e0._20_4_ * auVar87._20_4_;
                auVar71._24_4_ = local_13e0._24_4_ * auVar87._24_4_;
                auVar71._28_4_ = auVar87._28_4_;
                auVar87 = vminps_avx(auVar71,auVar176);
                auVar33 = vsubps_avx(auVar176,auVar112);
                local_1300 = vblendvps_avx(auVar87,auVar33,local_1220);
                auVar87 = vsubps_avx(auVar176,auVar87);
                local_1320 = vblendvps_avx(auVar112,auVar87,local_1220);
                fVar95 = local_1240._0_4_;
                fVar102 = local_1240._4_4_;
                fVar3 = local_1240._8_4_;
                fVar14 = local_1240._12_4_;
                fVar15 = local_1240._16_4_;
                fVar16 = local_1240._20_4_;
                fVar17 = local_1240._24_4_;
                uStack_12a4 = local_1320._28_4_;
                local_12c0[0] = fVar96 * fVar95;
                local_12c0[1] = fVar103 * fVar102;
                local_12c0[2] = fVar28 * fVar3;
                local_12c0[3] = fVar29 * fVar14;
                fStack_12b0 = fVar30 * fVar15;
                fStack_12ac = fVar31 * fVar16;
                fStack_12a8 = fVar32 * fVar17;
                local_12a0[0] = fVar169 * fVar95;
                local_12a0[1] = fVar171 * fVar102;
                local_12a0[2] = fVar173 * fVar3;
                local_12a0[3] = fVar178 * fVar14;
                fStack_1290 = fVar179 * fVar15;
                fStack_128c = fVar180 * fVar16;
                fStack_1288 = fVar181 * fVar17;
                uStack_1284 = uStack_12a4;
                auVar116._16_16_ = auVar108;
                auVar116._0_16_ = auVar97;
                auVar128._8_4_ = 0x7f800000;
                auVar128._0_8_ = 0x7f8000007f800000;
                auVar128._12_4_ = 0x7f800000;
                auVar128._16_4_ = 0x7f800000;
                auVar128._20_4_ = 0x7f800000;
                auVar128._24_4_ = 0x7f800000;
                auVar128._28_4_ = 0x7f800000;
                auVar87 = vblendvps_avx(auVar128,local_12e0,auVar116);
                local_1280[0] = fVar95 * fVar165;
                local_1280[1] = fVar102 * fVar143;
                local_1280[2] = fVar3 * fVar167;
                local_1280[3] = fVar14 * fVar104;
                fStack_1270 = fVar15 * fVar105;
                fStack_126c = fVar16 * fVar106;
                fStack_1268 = fVar17 * fVar107;
                uStack_1264 = uStack_12a4;
                auVar112 = vshufps_avx(auVar87,auVar87,0xb1);
                auVar112 = vminps_avx(auVar87,auVar112);
                auVar33 = vshufpd_avx(auVar112,auVar112,5);
                auVar112 = vminps_avx(auVar112,auVar33);
                auVar33 = vperm2f128_avx(auVar112,auVar112,1);
                auVar112 = vminps_avx(auVar112,auVar33);
                auVar87 = vcmpps_avx(auVar87,auVar112,0);
                auVar97 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
                auVar86 = vpand_avx(auVar97,auVar86);
                auVar97 = vpmovsxwd_avx(auVar86);
                auVar86 = vpunpckhwd_avx(auVar86,auVar86);
                auVar99._16_16_ = auVar86;
                auVar99._0_16_ = auVar97;
                if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar99 >> 0x7f,0) == '\0') &&
                      (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar86 >> 0x3f,0) == '\0') &&
                    (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar86[0xf]) {
                  auVar99 = local_1520;
                }
                uVar73 = vmovmskps_avx(auVar99);
                uVar78 = 0;
                fStack_14d4 = fStack_14d8;
                fStack_14d0 = fStack_14d8;
                fStack_14cc = fStack_14d8;
                fStack_14c8 = fStack_14d8;
                fStack_14c4 = fStack_14d8;
                local_1180 = auVar44;
                if (uVar73 != 0) {
                  for (; (uVar73 >> uVar78 & 1) == 0; uVar78 = uVar78 + 1) {
                  }
                }
LAB_003a66e5:
                uVar81 = (ulong)uVar78;
                uVar78 = *(uint *)((long)&local_10e0 + uVar81 * 4);
                pGVar83 = (pSVar7->geometries).items[uVar78].ptr;
                if ((pGVar83->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_1520 + uVar81 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar83->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar2 = *(undefined4 *)(local_1320 + uVar81 * 4);
                    uVar5 = *(undefined4 *)(local_1300 + uVar81 * 4);
                    *(float *)(ray + k * 4 + 0x100) = local_12c0[uVar81 - 8];
                    *(float *)(ray + k * 4 + 0x180) = local_12c0[uVar81];
                    *(float *)(ray + k * 4 + 0x1a0) = local_12a0[uVar81];
                    *(float *)(ray + k * 4 + 0x1c0) = local_1280[uVar81];
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar5;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)((long)&local_1420 + uVar81 * 4);
                    *(uint *)(ray + k * 4 + 0x240) = uVar78;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    goto LAB_003a6b97;
                  }
                  uVar2 = *(undefined4 *)(local_1320 + uVar81 * 4);
                  local_1060._4_4_ = uVar2;
                  local_1060._0_4_ = uVar2;
                  local_1060._8_4_ = uVar2;
                  local_1060._12_4_ = uVar2;
                  local_1060._16_4_ = uVar2;
                  local_1060._20_4_ = uVar2;
                  local_1060._24_4_ = uVar2;
                  local_1060._28_4_ = uVar2;
                  local_1040 = *(undefined4 *)(local_1300 + uVar81 * 4);
                  auStack_ff0 = vpshufd_avx(ZEXT416(uVar78),0);
                  local_1020 = *(undefined4 *)((long)&local_1420 + uVar81 * 4);
                  fVar95 = local_12c0[uVar81];
                  fVar102 = local_12a0[uVar81];
                  local_10a0._4_4_ = fVar102;
                  local_10a0._0_4_ = fVar102;
                  local_10a0._8_4_ = fVar102;
                  local_10a0._12_4_ = fVar102;
                  local_10a0._16_4_ = fVar102;
                  local_10a0._20_4_ = fVar102;
                  local_10a0._24_4_ = fVar102;
                  local_10a0._28_4_ = fVar102;
                  fVar102 = local_1280[uVar81];
                  local_1080._4_4_ = fVar102;
                  local_1080._0_4_ = fVar102;
                  local_1080._8_4_ = fVar102;
                  local_1080._12_4_ = fVar102;
                  local_1080._16_4_ = fVar102;
                  local_1080._20_4_ = fVar102;
                  local_1080._24_4_ = fVar102;
                  local_1080._28_4_ = fVar102;
                  local_10c0[0] = (RTCHitN)SUB41(fVar95,0);
                  local_10c0[1] = (RTCHitN)(char)((uint)fVar95 >> 8);
                  local_10c0[2] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
                  local_10c0[3] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
                  local_10c0[4] = (RTCHitN)SUB41(fVar95,0);
                  local_10c0[5] = (RTCHitN)(char)((uint)fVar95 >> 8);
                  local_10c0[6] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
                  local_10c0[7] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
                  local_10c0[8] = (RTCHitN)SUB41(fVar95,0);
                  local_10c0[9] = (RTCHitN)(char)((uint)fVar95 >> 8);
                  local_10c0[10] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
                  local_10c0[0xb] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
                  local_10c0[0xc] = (RTCHitN)SUB41(fVar95,0);
                  local_10c0[0xd] = (RTCHitN)(char)((uint)fVar95 >> 8);
                  local_10c0[0xe] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
                  local_10c0[0xf] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
                  local_10c0[0x10] = (RTCHitN)SUB41(fVar95,0);
                  local_10c0[0x11] = (RTCHitN)(char)((uint)fVar95 >> 8);
                  local_10c0[0x12] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
                  local_10c0[0x13] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
                  local_10c0[0x14] = (RTCHitN)SUB41(fVar95,0);
                  local_10c0[0x15] = (RTCHitN)(char)((uint)fVar95 >> 8);
                  local_10c0[0x16] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
                  local_10c0[0x17] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
                  local_10c0[0x18] = (RTCHitN)SUB41(fVar95,0);
                  local_10c0[0x19] = (RTCHitN)(char)((uint)fVar95 >> 8);
                  local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
                  local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
                  local_10c0[0x1c] = (RTCHitN)SUB41(fVar95,0);
                  local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar95 >> 8);
                  local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
                  local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
                  uStack_103c = local_1040;
                  uStack_1038 = local_1040;
                  uStack_1034 = local_1040;
                  uStack_1030 = local_1040;
                  uStack_102c = local_1040;
                  uStack_1028 = local_1040;
                  uStack_1024 = local_1040;
                  uStack_101c = local_1020;
                  uStack_1018 = local_1020;
                  uStack_1014 = local_1020;
                  uStack_1010 = local_1020;
                  uStack_100c = local_1020;
                  uStack_1008 = local_1020;
                  uStack_1004 = local_1020;
                  local_1000 = auStack_ff0;
                  vcmpps_avx(local_1060,local_1060,0xf);
                  uStack_fdc = context->user->instID[0];
                  local_fe0 = uStack_fdc;
                  uStack_fd8 = uStack_fdc;
                  uStack_fd4 = uStack_fdc;
                  uStack_fd0 = uStack_fdc;
                  uStack_fcc = uStack_fdc;
                  uStack_fc8 = uStack_fdc;
                  uStack_fc4 = uStack_fdc;
                  uStack_fbc = context->user->instPrimID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = uStack_fbc;
                  uStack_fac = uStack_fbc;
                  uStack_fa8 = uStack_fbc;
                  uStack_fa4 = uStack_fbc;
                  *(float *)(ray + k * 4 + 0x100) = local_12c0[uVar81 - 8];
                  local_1580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar80 & 0xf) << 4));
                  local_1570 = *(undefined1 (*) [16])
                                (mm_lookupmask_ps + (long)((int)uVar80 >> 4) * 0x10);
                  local_1550.valid = (int *)local_1580;
                  local_1550.geometryUserPtr = pGVar83->userPtr;
                  local_1550.context = context->user;
                  local_1550.hit = local_10c0;
                  local_1550.N = 8;
                  local_1550.ray = (RTCRayN *)ray;
                  if (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_14e0 = pGVar83;
                    (*pGVar83->intersectionFilterN)(&local_1550);
                    auVar148 = ZEXT3264(auVar148._0_32_);
                    pGVar83 = local_14e0;
                  }
                  auVar86 = vpcmpeqd_avx(local_1580,ZEXT816(0) << 0x40);
                  auVar97 = vpcmpeqd_avx(local_1570,ZEXT816(0) << 0x40);
                  auVar117._16_16_ = auVar97;
                  auVar117._0_16_ = auVar86;
                  auVar87 = vcmpps_avx(ZEXT1632(auVar97),ZEXT1632(auVar97),0xf);
                  auVar112 = auVar87 & ~auVar117;
                  if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar112 >> 0x7f,0) == '\0') &&
                        (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar112 >> 0xbf,0) == '\0') &&
                      (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar112[0x1f]) {
                    auVar89._0_4_ = auVar86._0_4_ ^ auVar87._0_4_;
                    auVar89._4_4_ = auVar86._4_4_ ^ auVar87._4_4_;
                    auVar89._8_4_ = auVar86._8_4_ ^ auVar87._8_4_;
                    auVar89._12_4_ = auVar86._12_4_ ^ auVar87._12_4_;
                    auVar89._16_4_ = auVar97._0_4_ ^ auVar87._16_4_;
                    auVar89._20_4_ = auVar97._4_4_ ^ auVar87._20_4_;
                    auVar89._24_4_ = auVar97._8_4_ ^ auVar87._24_4_;
                    auVar89._28_4_ = auVar97._12_4_ ^ auVar87._28_4_;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar83->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&local_1550);
                      auVar148 = ZEXT3264(auVar148._0_32_);
                    }
                    auVar108 = ZEXT816(0) << 0x40;
                    auVar86 = vpcmpeqd_avx(local_1580,auVar108);
                    auVar97 = vpcmpeqd_avx(local_1570,auVar108);
                    auVar101._16_16_ = auVar97;
                    auVar101._0_16_ = auVar86;
                    auVar87 = vcmpps_avx(ZEXT1632(auVar108),ZEXT1632(auVar108),0xf);
                    auVar89._0_4_ = auVar86._0_4_ ^ auVar87._0_4_;
                    auVar89._4_4_ = auVar86._4_4_ ^ auVar87._4_4_;
                    auVar89._8_4_ = auVar86._8_4_ ^ auVar87._8_4_;
                    auVar89._12_4_ = auVar86._12_4_ ^ auVar87._12_4_;
                    auVar89._16_4_ = auVar97._0_4_ ^ auVar87._16_4_;
                    auVar89._20_4_ = auVar97._4_4_ ^ auVar87._20_4_;
                    auVar89._24_4_ = auVar97._8_4_ ^ auVar87._24_4_;
                    auVar89._28_4_ = auVar97._12_4_ ^ auVar87._28_4_;
                    auVar87 = auVar87 & ~auVar101;
                    if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar87 >> 0x7f,0) != '\0') ||
                          (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar87 >> 0xbf,0) != '\0') ||
                        (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar87[0x1f] < '\0') {
                      auVar87 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])local_1550.hit);
                      *(undefined1 (*) [32])(local_1550.ray + 0x180) = auVar87;
                      auVar87 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(local_1550.hit + 0x20)
                                              );
                      *(undefined1 (*) [32])(local_1550.ray + 0x1a0) = auVar87;
                      auVar87 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(local_1550.hit + 0x40)
                                              );
                      *(undefined1 (*) [32])(local_1550.ray + 0x1c0) = auVar87;
                      auVar87 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(local_1550.hit + 0x60)
                                              );
                      *(undefined1 (*) [32])(local_1550.ray + 0x1e0) = auVar87;
                      auVar87 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(local_1550.hit + 0x80)
                                              );
                      *(undefined1 (*) [32])(local_1550.ray + 0x200) = auVar87;
                      auVar87 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(local_1550.hit + 0xa0)
                                              );
                      *(undefined1 (*) [32])(local_1550.ray + 0x220) = auVar87;
                      auVar87 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(local_1550.hit + 0xc0)
                                              );
                      *(undefined1 (*) [32])(local_1550.ray + 0x240) = auVar87;
                      auVar87 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(local_1550.hit + 0xe0)
                                              );
                      *(undefined1 (*) [32])(local_1550.ray + 0x260) = auVar87;
                      auVar87 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])
                                                        (local_1550.hit + 0x100));
                      *(undefined1 (*) [32])(local_1550.ray + 0x280) = auVar87;
                    }
                  }
                  if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar89 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar89 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar89 >> 0x7f,0) == '\0') &&
                        (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar89 >> 0xbf,0) == '\0') &&
                      (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar89[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_15e0._0_4_;
                  }
                  else {
                    local_15e0 = ZEXT432(*(uint *)(ray + k * 4 + 0x100));
                  }
                  *(undefined4 *)(local_1520 + uVar81 * 4) = 0;
                  auVar86 = vpermilps_avx(local_15e0._0_16_,0);
                  auVar90._16_16_ = auVar86;
                  auVar90._0_16_ = auVar86;
                  auVar87 = vcmpps_avx(auVar148._0_32_,auVar90,2);
                  local_1520 = vandps_avx(auVar87,local_1520);
                }
                if ((((((((local_1520 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1520 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1520 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1520 >> 0x7f,0) == '\0') &&
                      (local_1520 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_1520 >> 0xbf,0) == '\0') &&
                    (local_1520 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_1520[0x1f]) goto LAB_003a6b97;
                auVar100._8_4_ = 0x7f800000;
                auVar100._0_8_ = 0x7f8000007f800000;
                auVar100._12_4_ = 0x7f800000;
                auVar100._16_4_ = 0x7f800000;
                auVar100._20_4_ = 0x7f800000;
                auVar100._24_4_ = 0x7f800000;
                auVar100._28_4_ = 0x7f800000;
                auVar87 = vblendvps_avx(auVar100,auVar148._0_32_,local_1520);
                auVar112 = vshufps_avx(auVar87,auVar87,0xb1);
                auVar112 = vminps_avx(auVar87,auVar112);
                auVar33 = vshufpd_avx(auVar112,auVar112,5);
                auVar112 = vminps_avx(auVar112,auVar33);
                auVar33 = vperm2f128_avx(auVar112,auVar112,1);
                auVar112 = vminps_avx(auVar112,auVar33);
                auVar112 = vcmpps_avx(auVar87,auVar112,0);
                auVar33 = local_1520 & auVar112;
                auVar87 = local_1520;
                if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar33 >> 0x7f,0) != '\0') ||
                      (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar33 >> 0xbf,0) != '\0') ||
                    (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar33[0x1f] < '\0') {
                  auVar87 = vandps_avx(auVar112,local_1520);
                }
                uVar73 = vmovmskps_avx(auVar87);
                uVar78 = 0;
                if (uVar73 != 0) {
                  for (; (uVar73 >> uVar78 & 1) == 0; uVar78 = uVar78 + 1) {
                  }
                }
                goto LAB_003a66e5;
              }
            }
          }
LAB_003a6b97:
          lVar76 = lVar76 + 1;
        } while (lVar76 != uVar77 - 8);
      }
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar91 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
      auVar156 = ZEXT1664(local_1430);
      auVar160 = ZEXT1664(local_1440);
      auVar177 = ZEXT1664(local_1450);
      auVar186 = ZEXT1664(local_1460);
      auVar189 = ZEXT1664(local_1470);
      auVar199 = ZEXT1664(local_1480);
      auVar213 = ZEXT1664(local_1490);
      auVar215 = ZEXT1664(local_14a0);
      auVar218 = ZEXT1664(local_14b0);
      auVar148 = ZEXT1664(local_14f0);
    }
    if (pauVar74 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }